

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestProperties
               (ostream *stream,TestResult *result)

{
  ostream *poVar1;
  TestProperty *pTVar2;
  int i;
  string kProperties;
  string kProperty;
  allocator<char> local_b1;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80 [2];
  string local_70;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"properties","");
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"property","");
  if (0 < (int)((ulong)((long)(result->test_properties_).
                              super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_properties_).
                             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"      <",7);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_90,local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,">\n",2);
    if (0 < (int)((ulong)((long)(result->test_properties_).
                                super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(result->test_properties_).
                               super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
      i = 0;
      do {
        pTVar2 = TestResult::GetTestProperty(result,i);
        std::__ostream_insert<char,std::char_traits<char>>(stream,"        <",9);
        std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_50,local_48);
        std::__ostream_insert<char,std::char_traits<char>>(stream," name=\"",7);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,(pTVar2->key_)._M_dataplus._M_p,&local_b1);
        EscapeXml(&local_b0,&local_70,true);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream," value=\"",8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,(pTVar2->value_)._M_dataplus._M_p,&local_b1);
        EscapeXml(&local_b0,&local_70,true);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"/>\n",3);
        i = i + 1;
      } while (i < (int)((ulong)((long)(result->test_properties_).
                                       super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(result->test_properties_).
                                      super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 6));
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"      </",8);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_90,local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,">\n",2);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestProperties(
    std::ostream* stream, const TestResult& result) {
  const std::string kProperties = "properties";
  const std::string kProperty = "property";

  if (result.test_property_count() <= 0) {
    return;
  }

  *stream << "      <" << kProperties << ">\n";
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    *stream << "        <" << kProperty;
    *stream << " name=\"" << EscapeXmlAttribute(property.key()) << "\"";
    *stream << " value=\"" << EscapeXmlAttribute(property.value()) << "\"";
    *stream << "/>\n";
  }
  *stream << "      </" << kProperties << ">\n";
}